

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QDockAreaLayout *layout)

{
  QTextStream *pQVar1;
  long in_RDX;
  undefined8 *puVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  undefined4 local_108;
  undefined4 uStack_104;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  QArrayData *local_f8;
  undefined8 *puStack_f0;
  undefined8 local_e8;
  QString local_d8;
  QString local_b8;
  QString local_98;
  QString local_78;
  QArrayData *local_58;
  char16_t *pcStack_50;
  qsizetype local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8 = (QArrayData *)0x0;
  puStack_f0 = (undefined8 *)0x0;
  local_e8 = 0;
  local_108 = 0xaaaaaaaa;
  uStack_104 = 0xaaaaaaaa;
  uStack_100 = 0xaaaaaaaa;
  uStack_fc = 0xaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_108,&local_f8,3);
  pQVar1 = (QTextStream *)QTextStream::operator<<((QTextStream *)&local_108,"QDockAreaLayout: ");
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,*(int *)(in_RDX + 0x10));
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,',');
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,*(int *)(in_RDX + 0x14));
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,' ');
  pQVar1 = (QTextStream *)
           QTextStream::operator<<(pQVar1,(*(int *)(in_RDX + 0x18) - *(int *)(in_RDX + 0x10)) + 1);
  pQVar1 = (QTextStream *)QTextStream::operator<<(pQVar1,'x');
  pQVar1 = (QTextStream *)
           QTextStream::operator<<(pQVar1,(*(int *)(in_RDX + 0x1c) - *(int *)(in_RDX + 0x14)) + 1);
  QTextStream::operator<<(pQVar1,'\n');
  QTextStream::operator<<((QTextStream *)&local_108,"TopDockArea:\n");
  QVar3.m_data = (storage_type *)0x2;
  QVar3.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar3);
  local_78.d.d = (Data *)local_58;
  local_78.d.ptr = pcStack_50;
  local_78.d.size = local_48;
  dumpLayout((QTextStream *)&local_108,(QDockAreaLayoutInfo *)(in_RDX + 0x120),&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  QTextStream::operator<<((QTextStream *)&local_108,"LeftDockArea:\n");
  QVar4.m_data = (storage_type *)0x2;
  QVar4.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar4);
  local_98.d.d = (Data *)local_58;
  local_98.d.ptr = pcStack_50;
  local_98.d.size = local_48;
  dumpLayout((QTextStream *)&local_108,(QDockAreaLayoutInfo *)(in_RDX + 0x40),&local_98);
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  QTextStream::operator<<((QTextStream *)&local_108,"RightDockArea:\n");
  QVar5.m_data = (storage_type *)0x2;
  QVar5.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar5);
  local_b8.d.d = (Data *)local_58;
  local_b8.d.ptr = pcStack_50;
  local_b8.d.size = local_48;
  dumpLayout((QTextStream *)&local_108,(QDockAreaLayoutInfo *)(in_RDX + 0xb0),&local_b8);
  if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QTextStream::operator<<((QTextStream *)&local_108,"BottomDockArea:\n");
  QVar6.m_data = (storage_type *)0x2;
  QVar6.m_size = (qsizetype)&local_58;
  QString::fromLatin1(QVar6);
  local_d8.d.d = (Data *)local_58;
  local_d8.d.ptr = pcStack_50;
  local_d8.d.size = local_48;
  dumpLayout((QTextStream *)&local_108,(QDockAreaLayoutInfo *)(in_RDX + 400),&local_d8);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  puVar2 = puStack_f0;
  if (puStack_f0 == (undefined8 *)0x0) {
    puVar2 = &QString::_empty;
  }
  QDebug::putString((QChar *)layout,(ulong)puVar2);
  pQVar1 = *(QTextStream **)layout->corners;
  if (pQVar1[0x30] == (QTextStream)0x1) {
    QTextStream::operator<<(pQVar1,' ');
    pQVar1 = *(QTextStream **)layout->corners;
  }
  layout->corners[0] = NoDockWidgetArea;
  layout->corners[1] = NoDockWidgetArea;
  *(QTextStream **)debug.stream = pQVar1;
  QTextStream::~QTextStream((QTextStream *)&local_108);
  if (local_f8 != (QArrayData *)0x0) {
    LOCK();
    (local_f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_f8,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QDockAreaLayout &layout)
{
    QString s;
    QTextStream str(&s);
    dumpLayout(str, layout);
    debug << s;
    return debug;
}